

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall
spdlog::details::registry::initialize_logger(registry *this,shared_ptr<spdlog::logger> *new_logger)

{
  logger *this_00;
  element_type *peVar1;
  iterator iVar2;
  level_enum *plVar3;
  _Head_base<0UL,_spdlog::formatter_*,_false> local_60;
  shared_ptr<spdlog::logger> local_58;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  
  std::mutex::lock(&this->logger_map_mutex_);
  this_00 = (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*((this->formatter_)._M_t.
     super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
     super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
     super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[3])(&local_60)
  ;
  logger::set_formatter
            (this_00,(unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                     &local_60);
  if (local_60._M_head_impl != (formatter *)0x0) {
    (*(local_60._M_head_impl)->_vptr_formatter[1])();
  }
  local_60._M_head_impl = (formatter *)0x0;
  if ((this->err_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    peVar1 = (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_40,&this->err_handler_);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&peVar1->custom_err_handler_,&local_40);
    std::_Function_base::~_Function_base(&local_40.super__Function_base);
  }
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->log_levels_)._M_h,
                 &((new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->name_);
  plVar3 = (level_enum *)
           ((long)iVar2.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                  ._M_cur + 0x28);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
      ._M_cur == (__node_type *)0x0) {
    plVar3 = &this->global_log_level_;
  }
  LOCK();
  (((new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->level_).
  super___atomic_base<int>._M_i = *plVar3;
  UNLOCK();
  LOCK();
  (((new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
  flush_level_).super___atomic_base<int>._M_i = this->flush_level_;
  UNLOCK();
  if (this->backtrace_n_messages_ != 0) {
    backtracer::enable(&((new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->tracer_,this->backtrace_n_messages_);
  }
  if (this->automatic_registration_ == true) {
    local_58.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    register_logger_(this,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::initialize_logger(std::shared_ptr<logger> new_logger) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    new_logger->set_formatter(formatter_->clone());

    if (err_handler_) {
        new_logger->set_error_handler(err_handler_);
    }

    // set new level according to previously configured level or default level
    auto it = log_levels_.find(new_logger->name());
    auto new_level = it != log_levels_.end() ? it->second : global_log_level_;
    new_logger->set_level(new_level);

    new_logger->flush_on(flush_level_);

    if (backtrace_n_messages_ > 0) {
        new_logger->enable_backtrace(backtrace_n_messages_);
    }

    if (automatic_registration_) {
        register_logger_(std::move(new_logger));
    }
}